

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bezier.cpp
# Opt level: O2

pair<Polynomial,_Polynomial> * __thiscall
Bezier::P2d(pair<Polynomial,_Polynomial> *__return_storage_ptr__,Bezier *this,int l,int n)

{
  double *__x;
  double *__y;
  _Vector_base<double,_std::allocator<double>_> _Stack_188;
  _Vector_base<double,_std::allocator<double>_> local_170;
  _Vector_base<double,_std::allocator<double>_> local_158;
  _Vector_base<double,_std::allocator<double>_> local_140;
  _Vector_base<double,_std::allocator<double>_> local_128;
  _Vector_base<double,_std::allocator<double>_> local_110;
  _Vector_base<double,_std::allocator<double>_> local_f8;
  _Vector_base<double,_std::allocator<double>_> local_e0;
  _Vector_base<double,_std::allocator<double>_> local_c8;
  pair<Polynomial,_Polynomial> rhs;
  pair<Polynomial,_Polynomial> lhs;
  _Vector_base<double,_std::allocator<double>_> local_48;
  
  if (n == 1) {
    __x = Vector3::operator[]((this->control_points).
                              super__Vector_base<Vector3,_std::allocator<Vector3>_>._M_impl.
                              super__Vector_impl_data._M_start + l,0);
    __y = Vector3::operator[]((this->control_points).
                              super__Vector_base<Vector3,_std::allocator<Vector3>_>._M_impl.
                              super__Vector_impl_data._M_start + l,1);
    std::pair<Polynomial,_Polynomial>::pair<double_&,_double_&,_true>
              (__return_storage_ptr__,__x,__y);
  }
  else {
    P2d(&lhs,this,l,n + -1);
    P2d(&rhs,this,l + 1,n + -1);
    Polynomial::Polynomial((Polynomial *)&local_f8,1.0,-1.0);
    Polynomial::operator*((Polynomial *)&local_e0,(Polynomial *)&local_f8,&lhs.first);
    Polynomial::Polynomial((Polynomial *)&local_128,0.0,1.0);
    Polynomial::operator*((Polynomial *)&local_110,(Polynomial *)&local_128,&rhs.first);
    Polynomial::operator+((Polynomial *)&local_c8,(Polynomial *)&local_e0,(Polynomial *)&local_110);
    Polynomial::Polynomial((Polynomial *)&local_158,1.0,-1.0);
    Polynomial::operator*((Polynomial *)&local_140,(Polynomial *)&local_158,&lhs.second);
    Polynomial::Polynomial((Polynomial *)&_Stack_188,0.0,1.0);
    Polynomial::operator*((Polynomial *)&local_170,(Polynomial *)&_Stack_188,&rhs.second);
    Polynomial::operator+((Polynomial *)&local_48,(Polynomial *)&local_140,(Polynomial *)&local_170)
    ;
    (__return_storage_ptr__->first).c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start = local_c8._M_impl.super__Vector_impl_data._M_start;
    (__return_storage_ptr__->first).c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = local_c8._M_impl.super__Vector_impl_data._M_finish;
    (__return_storage_ptr__->first).c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_c8._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_c8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_c8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_c8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->second).c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start = local_48._M_impl.super__Vector_impl_data._M_start;
    (__return_storage_ptr__->second).c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = local_48._M_impl.super__Vector_impl_data._M_finish;
    (__return_storage_ptr__->second).c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_48._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_48);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_170);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&_Stack_188);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_140);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_158);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_c8);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_110);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_128);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_e0);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_f8);
    std::pair<Polynomial,_Polynomial>::~pair(&rhs);
    std::pair<Polynomial,_Polynomial>::~pair(&lhs);
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<Polynomial, Polynomial> Bezier::P2d(int l, int n)
{
    if (n == 1)
        return std::pair<Polynomial, Polynomial>(control_points[l][0], control_points[l][1]);
    std::pair<Polynomial, Polynomial> lhs = P2d(l, n - 1), rhs = P2d(l + 1, n - 1);
    return std::pair<Polynomial, Polynomial>(Polynomial(1, -1) * lhs.first  + Polynomial(0, 1) * rhs.first,
                                             Polynomial(1, -1) * lhs.second + Polynomial(0, 1) * rhs.second);
}